

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prod_tests1.cpp
# Opt level: O0

void __thiscall
prod_test::iu_PeepTest_x_iutest_x_PeepMacro_Test::Body(iu_PeepTest_x_iutest_x_PeepMacro_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_b90;
  Fixed local_b60;
  int local_9d4;
  undefined1 local_9d0 [8];
  AssertionResult iutest_ar_5;
  Fixed local_978;
  int local_7f0 [2];
  undefined1 local_7e8 [8];
  AssertionResult iutest_ar_4;
  Fixed local_790;
  int local_604;
  undefined1 local_600 [8];
  AssertionResult iutest_ar_3;
  Fixed local_5a8;
  int local_420 [2];
  undefined1 local_418 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3c0;
  int local_234;
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  Fixed local_1d8;
  int local_40 [2];
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_PeepTest_x_iutest_x_PeepMacro_Test *this_local;
  
  *(undefined4 *)
   (s_prod + iutest::detail::peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProdClass>>::value) = 4;
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  local_40[1] = 4;
  local_40[0] = ProdClass::GetX((ProdClass *)s_prod);
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_38,"4","s_prod.GetX()",local_40 + 1,local_40);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_1.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x85,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_1.m_result,&local_1d8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_1.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  iutest::detail::AlwaysZero();
  local_234 = 4;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_230,"4",
             "(s_prod.*::iutest::detail::peep_tag< iu_peep_tag_m_x<ProdClass> >::value)",&local_234,
             (int *)(s_prod + iutest::detail::
                              peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProdClass>>::value));
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
  if (!bVar1) {
    memset(&local_3c0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_3c0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_2.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x87,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3c0);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_3c0);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
  *(undefined4 *)
   ((long)&s_prod2 +
   iutest::detail::peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProdClass2>>::value) = 0x2a;
  iutest::detail::AlwaysZero();
  local_420[1] = 0x2a;
  local_420[0] = ProdClass2::GetX((ProdClass2 *)&s_prod2);
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_418,"42","s_prod2.GetX()",local_420 + 1,local_420);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
  if (!bVar1) {
    memset(&local_5a8,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_5a8);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_418);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_3.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x8a,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_5a8);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_5a8);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_418);
  iutest::detail::AlwaysZero();
  local_604 = 0x2a;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_600,"42",
             "(s_prod2.*::iutest::detail::peep_tag< iu_peep_tag_m_x<ProdClass2> >::value)",
             &local_604,
             (int *)((long)&s_prod2 +
                    iutest::detail::peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProdClass2>>::
                    value));
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_600);
  if (!bVar1) {
    memset(&local_790,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_790);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_600);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_4.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x8c,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_4.m_result,&local_790);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_4.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_790);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_600);
  *(undefined4 *)
   ((long)&DAT_006275ff +
   iutest::detail::peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProtectedProdClass>>::value + 1) =
       0x2a;
  iutest::detail::AlwaysZero();
  local_7f0[1] = 0x2a;
  local_7f0[0] = ProtectedProdClass::GetX((ProtectedProdClass *)((long)&DAT_006275ff + 1));
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_7e8,"42","s_protected.GetX()",local_7f0 + 1,local_7f0);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7e8);
  if (!bVar1) {
    memset(&local_978,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_978);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7e8);
    iutest::AssertionHelper::AssertionHelper
              ((AssertionHelper *)&iutest_ar_5.m_result,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x8f,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_5.m_result,&local_978);
    iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_5.m_result);
    iutest::AssertionHelper::Fixed::~Fixed(&local_978);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7e8);
  iutest::detail::AlwaysZero();
  local_9d4 = 0x2a;
  iutest::internal::backward::EqHelper<false>::Compare<int>
            ((AssertionResult *)local_9d0,"42",
             "(s_protected.*::iutest::detail::peep_tag< iu_peep_tag_m_x<ProtectedProdClass> >::value)"
             ,&local_9d4,
             (int *)((long)&DAT_006275ff +
                    iutest::detail::
                    peep_tag<prod_test::iu_peep_tag_m_x<prod_test::ProtectedProdClass>>::value + 1))
  ;
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9d0);
  if (!bVar1) {
    memset(&local_b60,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_b60);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9d0);
    iutest::AssertionHelper::AssertionHelper
              (&local_b90,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/prod_tests1.cpp"
               ,0x91,pcVar2,kNonFatalFailure);
    iutest::AssertionHelper::operator=(&local_b90,&local_b60);
    iutest::AssertionHelper::~AssertionHelper(&local_b90);
    iutest::AssertionHelper::Fixed::~Fixed(&local_b60);
  }
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9d0);
  return;
}

Assistant:

IUTEST(PeepTest, PeepMacro)
{
    IUTEST_PEEP_GET(s_prod, ProdClass, m_x) = 4;
    IUTEST_EXPECT_EQ(4, s_prod.GetX());

    IUTEST_EXPECT_EQ(4, IUTEST_PEEP_GET(s_prod, ProdClass, m_x));

    IUTEST_PEEP_GET(s_prod2, ProdClass2, m_x) = 42;
    IUTEST_EXPECT_EQ(42, s_prod2.GetX());

    IUTEST_EXPECT_EQ(42, IUTEST_PEEP_GET(s_prod2, ProdClass2, m_x));

    IUTEST_PEEP_GET(s_protected, ProtectedProdClass, m_x) = 42;
    IUTEST_EXPECT_EQ(42, s_protected.GetX());

    IUTEST_EXPECT_EQ(42, IUTEST_PEEP_GET(s_protected, ProtectedProdClass, m_x));
}